

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSessionTests::initiatorFIX40FixtureCustomFIX40_UnsupportedMessageType_ERRejectHelper::
~initiatorFIX40FixtureCustomFIX40_UnsupportedMessageType_ERRejectHelper
          (initiatorFIX40FixtureCustomFIX40_UnsupportedMessageType_ERRejectHelper *this)

{
  sessionFIX40Fixture::~sessionFIX40Fixture((sessionFIX40Fixture *)&this[-1].m_details);
  operator_delete(&this[-1].m_details,0x630);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFIX40Fixture, CustomFIX40_UnsupportedMessageType_ERReject)
{
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  SessionID sessionID( BeginString( "FIX.4.0" ),
                       SenderCompID( "TW" ), TargetCompID( "ISLD" ) );
  TimeRange sessionTime( startTime, endTime, 0, 31 );


  DataDictionaryProvider provider;
  provider.addTransportDataDictionary( sessionID.getBeginString(), "../spec/FIX40.xml" );
  DataDictionary dictionary = provider.getSessionDataDictionary(sessionID.getBeginString());

  std::shared_ptr<DataDictionary> pDataDictionary = std::make_shared<DataDictionary>(dictionary);
  pDataDictionary->addField(FIELD::RefMsgType);
  pDataDictionary->addFieldName(FIELD::RefMsgType, "RefMsgType");
  pDataDictionary->addMsgField(FIX::MsgType_Reject, FIELD::RefMsgType);

  provider.addTransportDataDictionary( sessionID.getBeginString(), pDataDictionary );

  object = new Session( *this, factory, sessionID, provider,
                         sessionTime, 1, 0 );
  object->setResponder( this );

  FIX::Message sentLogon = createFIX40Logon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createFIX40Logon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  FIX::Message executionReport = createFIX40ExecutionReport( "ISLD", "TW", 2 );

  object->next( executionReport, UtcTimeStamp() );
  CHECK_EQUAL(1, toReject);
}